

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O1

void anon_unknown.dwarf_202aafc::addInterfaceEntry
               (cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
               cmGeneratorExpressionDAGChecker *dagChecker,EvaluatedTargetPropertyEntries *entries,
               LinkInterfaceFor interfaceFor,
               vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries)

{
  pointer pcVar1;
  cmLocalGenerator *lg;
  EmptyElements emptyElements;
  pointer pcVar2;
  string_view value;
  cmListFileBacktrace local_260;
  string local_250;
  string local_230;
  string local_210;
  EvaluatedTargetPropertyEntries *local_1f0;
  string *local_1e8;
  cmGeneratorExpressionDAGChecker *local_1e0;
  string *local_1d8;
  pointer local_1d0;
  EvaluatedTargetPropertyEntry local_1c8;
  cmGeneratorExpressionContext context;
  
  pcVar2 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1d0 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 != local_1d0) {
    local_1f0 = entries;
    local_1e8 = prop;
    local_1e0 = dagChecker;
    local_1d8 = lang;
    do {
      if ((pcVar2->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
        local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pcVar2->super_cmLinkItem).Backtrace.
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pcVar2->super_cmLinkItem).Backtrace.
             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_1c8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_1c8._41_8_ = 0;
        local_1c8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_1c8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_1c8.LinkImplItem = pcVar2;
        lg = cmGeneratorTarget::GetLocalGenerator(headTarget);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        pcVar1 = (config->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,pcVar1,pcVar1 + config->_M_string_length);
        local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pcVar2->super_cmLinkItem).Backtrace.
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pcVar2->super_cmLinkItem).Backtrace.
             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        pcVar1 = (local_1d8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,pcVar1,pcVar1 + local_1d8->_M_string_length);
        cmGeneratorExpressionContext::cmGeneratorExpressionContext
                  (&context,lg,&local_250,false,headTarget,headTarget,true,&local_260,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_260.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        emptyElements = interfaceFor;
        cmGeneratorTarget::EvaluateInterfaceProperty
                  (&local_230,(pcVar2->super_cmLinkItem).Target,local_1e8,&context,local_1e0,
                   interfaceFor);
        value._M_str = (char *)0x0;
        value._M_len = (size_t)local_230._M_dataplus._M_p;
        cmList::insert((cmList *)&local_1c8.Values,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT71(local_1c8.Values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                   local_1c8.Values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_1_),
                       (const_iterator)local_230._M_string_length,value,emptyElements);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        local_1c8.ContextDependent = context.HadContextSensitiveCondition;
        std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
        emplace_back<EvaluatedTargetPropertyEntry>(&local_1f0->Entries,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)context.Language._M_dataplus._M_p != &context.Language.field_2) {
          operator_delete(context.Language._M_dataplus._M_p,
                          context.Language.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)context.Config._M_dataplus._M_p != &context.Config.field_2) {
          operator_delete(context.Config._M_dataplus._M_p,
                          context.Config.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree(&context.MaxLanguageStandard._M_t);
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~_Rb_tree(&context.SourceSensitiveTargets._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&context.SeenTargetProperties._M_t);
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~_Rb_tree(&context.AllTargets._M_t);
        std::
        _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
        ::~_Rb_tree(&context.DependTargets._M_t);
        if (context.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (context.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c8.Values);
        if (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != local_1d0);
  }
  return;
}

Assistant:

void addInterfaceEntry(cmGeneratorTarget const* headTarget,
                       std::string const& config, std::string const& prop,
                       std::string const& lang,
                       cmGeneratorExpressionDAGChecker* dagChecker,
                       EvaluatedTargetPropertyEntries& entries,
                       cmGeneratorTarget::LinkInterfaceFor interfaceFor,
                       std::vector<cmLinkImplItem> const& libraries)
{
  for (cmLinkImplItem const& lib : libraries) {
    if (lib.Target) {
      EvaluatedTargetPropertyEntry ee(lib, lib.Backtrace);
      // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in our
      // caller's property and hand-evaluate it as if it were compiled.
      // Create a context as cmCompiledGeneratorExpression::Evaluate does.
      cmGeneratorExpressionContext context(
        headTarget->GetLocalGenerator(), config, false, headTarget, headTarget,
        true, lib.Backtrace, lang);
      cmExpandList(lib.Target->EvaluateInterfaceProperty(
                     prop, &context, dagChecker, interfaceFor),
                   ee.Values);
      ee.ContextDependent = context.HadContextSensitiveCondition;
      entries.Entries.emplace_back(std::move(ee));
    }
  }
}